

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImVec2 CalcNextScrollFromScrollTargetAndClamp(ImGuiWindow *window,bool snap_on_edges)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  ImVec2 local_48;
  ImVec2 local_40;
  float local_38;
  float local_34;
  float target_y;
  float cr_y;
  float target_x;
  float cr_x;
  ImGuiContext *g;
  ImGuiWindow *pIStack_18;
  bool snap_on_edges_local;
  ImGuiWindow *window_local;
  ImVec2 scroll;
  
  _target_x = GImGui;
  window_local = *(ImGuiWindow **)&window->Scroll;
  g._7_1_ = snap_on_edges;
  pIStack_18 = window;
  if ((window->ScrollTarget).x <= 3.4028235e+38 && (window->ScrollTarget).x != 3.4028235e+38) {
    fVar4 = (window->ScrollTargetCenterRatio).x;
    target_y = (window->ScrollTarget).x;
    if (((!snap_on_edges) || (0.0 < fVar4)) || ((window->WindowPadding).x < target_y)) {
      if (((snap_on_edges) && (1.0 <= fVar4)) &&
         ((window->ContentSize).x + (window->WindowPadding).x + (GImGui->Style).ItemSpacing.x <=
          target_y)) {
        fVar2 = (window->WindowPadding).x;
        target_y = fVar2 + fVar2 + (window->ContentSize).x;
      }
    }
    else {
      target_y = 0.0;
    }
    fVar2 = target_y;
    cr_y = fVar4;
    fVar3 = ImRect::GetWidth(&window->InnerRect);
    window_local = (ImGuiWindow *)CONCAT44(window_local._4_4_,-fVar4 * fVar3 + fVar2);
  }
  pfVar1 = &(pIStack_18->ScrollTarget).y;
  if (*pfVar1 <= 3.4028235e+38 && *pfVar1 != 3.4028235e+38) {
    fVar4 = (pIStack_18->ScrollTargetCenterRatio).y;
    local_38 = (pIStack_18->ScrollTarget).y;
    if ((((g._7_1_ & 1) != 0) && (fVar4 <= 0.0)) && (local_38 <= (pIStack_18->WindowPadding).y)) {
      local_38 = 0.0;
    }
    if ((((g._7_1_ & 1) != 0) && (1.0 <= fVar4)) &&
       ((pIStack_18->ContentSize).y + (pIStack_18->WindowPadding).y +
        (_target_x->Style).ItemSpacing.y <= local_38)) {
      fVar2 = (pIStack_18->WindowPadding).y;
      local_38 = fVar2 + fVar2 + (pIStack_18->ContentSize).y;
    }
    fVar2 = local_38;
    local_34 = fVar4;
    fVar3 = ImRect::GetHeight(&pIStack_18->InnerRect);
    window_local = (ImGuiWindow *)CONCAT44(-fVar4 * fVar3 + fVar2,window_local._0_4_);
  }
  ImVec2::ImVec2(&local_48,0.0,0.0);
  local_40 = ImMax((ImVec2 *)&window_local,&local_48);
  window_local = (ImGuiWindow *)local_40;
  if (((pIStack_18->Collapsed & 1U) == 0) && ((pIStack_18->SkipItems & 1U) == 0)) {
    window_local._0_4_ = local_40.x;
    fVar4 = window_local._0_4_;
    fVar4 = ImMin<float>(fVar4,(pIStack_18->ScrollMax).x);
    window_local = (ImGuiWindow *)CONCAT44(window_local._4_4_,fVar4);
    fVar4 = ImMin<float>(window_local._4_4_,(pIStack_18->ScrollMax).y);
    window_local = (ImGuiWindow *)CONCAT44(fVar4,window_local._0_4_);
  }
  return (ImVec2)window_local;
}

Assistant:

static ImVec2 CalcNextScrollFromScrollTargetAndClamp(ImGuiWindow* window, bool snap_on_edges)
{
    ImGuiContext& g = *GImGui;
    ImVec2 scroll = window->Scroll;
    if (window->ScrollTarget.x < FLT_MAX)
    {
        float cr_x = window->ScrollTargetCenterRatio.x;
        float target_x = window->ScrollTarget.x;
        if (snap_on_edges && cr_x <= 0.0f && target_x <= window->WindowPadding.x)
            target_x = 0.0f;
        else if (snap_on_edges && cr_x >= 1.0f && target_x >= window->ContentSize.x + window->WindowPadding.x + GImGui->Style.ItemSpacing.x)
            target_x = window->ContentSize.x + window->WindowPadding.x * 2.0f;
        scroll.x = target_x - cr_x * window->InnerRect.GetWidth();
    }
    if (window->ScrollTarget.y < FLT_MAX)
    {
        // 'snap_on_edges' allows for a discontinuity at the edge of scrolling limits to take account of WindowPadding so that scrolling to make the last item visible scroll far enough to see the padding.
        float cr_y = window->ScrollTargetCenterRatio.y;
        float target_y = window->ScrollTarget.y;
        if (snap_on_edges && cr_y <= 0.0f && target_y <= window->WindowPadding.y)
            target_y = 0.0f;
        if (snap_on_edges && cr_y >= 1.0f && target_y >= window->ContentSize.y + window->WindowPadding.y + g.Style.ItemSpacing.y)
            target_y = window->ContentSize.y + window->WindowPadding.y * 2.0f;
        scroll.y = target_y - cr_y * window->InnerRect.GetHeight();
    }
    scroll = ImMax(scroll, ImVec2(0.0f, 0.0f));
    if (!window->Collapsed && !window->SkipItems)
    {
        scroll.x = ImMin(scroll.x, window->ScrollMax.x);
        scroll.y = ImMin(scroll.y, window->ScrollMax.y);
    }
    return scroll;
}